

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_sse42.c
# Opt level: O1

uint32_t av1_get_crc32c_value_sse4_2(void *crc_calculator,uint8_t *p,size_t len)

{
  uint uVar1;
  ulong uVar2;
  uint8_t *puVar3;
  size_t sVar4;
  uint8_t *buf;
  
  uVar2 = 0xffffffff;
  if (((ulong)p & 7) != 0 && len != 0) {
    puVar3 = p + 1;
    uVar1 = 0xffffffff;
    sVar4 = len;
    do {
      uVar1 = crc32(uVar1,*p);
      len = sVar4 - 1;
      p = p + 1;
      if (sVar4 == 1) break;
      uVar2 = (ulong)puVar3 & 7;
      puVar3 = puVar3 + 1;
      sVar4 = len;
    } while (uVar2 != 0);
    uVar2 = (ulong)uVar1;
  }
  for (; 7 < len; len = len - 8) {
    uVar2 = crc32(uVar2,*(undefined8 *)p);
    p = p + 8;
  }
  for (; uVar1 = (uint)uVar2, 3 < len; len = len - 4) {
    uVar1 = crc32(uVar1,*(undefined4 *)p);
    uVar2 = (ulong)uVar1;
    p = p + 4;
  }
  for (; 1 < len; len = len - 2) {
    uVar1 = crc32((int)uVar2,*(undefined2 *)p);
    uVar2 = (ulong)uVar1;
    p = p + 2;
  }
  if (len != 0) {
    uVar1 = crc32(uVar1,*p);
  }
  return ~uVar1;
}

Assistant:

uint32_t av1_get_crc32c_value_sse4_2(void *crc_calculator, uint8_t *p,
                                     size_t len) {
  (void)crc_calculator;
  const uint8_t *buf = p;
  uint32_t crc = 0xFFFFFFFF;

  // Align the input to the word boundary
  for (; (len > 0) && ((intptr_t)buf & ALIGN_MASK); len--, buf++) {
    crc = _mm_crc32_u8(crc, *buf);
  }

#ifdef __x86_64__
  uint64_t crc64 = crc;
  CALC_CRC(_mm_crc32_u64, crc64, uint64_t, buf, len)
  crc = (uint32_t)crc64;
#endif
  CALC_CRC(_mm_crc32_u32, crc, uint32_t, buf, len)
  CALC_CRC(_mm_crc32_u16, crc, uint16_t, buf, len)
  CALC_CRC(_mm_crc32_u8, crc, uint8_t, buf, len)
  return (crc ^ 0xFFFFFFFF);
}